

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

bool __thiscall
Clasp::UncoreMinimize::addOll(UncoreMinimize *this,Solver *s,LitPair *lits,uint32 size,weight_t w)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  
  (this->temp_).lits.ebo_.size = 0;
  (this->temp_).bound = 2;
  if (size != 0) {
    uVar4 = 0;
    do {
      WCTemp::add(&this->temp_,s,(Literal)lits[uVar4].lit.rep_);
      uVar4 = uVar4 + 1;
    } while (size != uVar4);
    uVar1 = (this->temp_).bound;
    uVar2 = (this->temp_).lits.ebo_.size;
    if ((int)uVar1 < 1 || uVar1 <= uVar2) {
      bVar3 = addOllCon(this,s,&this->temp_,w);
      return bVar3;
    }
    if (uVar1 < 2) {
      return true;
    }
    if (uVar2 != 0) {
      lits = (LitPair *)(this->temp_).lits.ebo_.buf;
    }
  }
  bVar3 = fixLit(this,s,(Literal)(((pointer)lits)->first).rep_);
  return bVar3;
}

Assistant:

bool UncoreMinimize::addOll(Solver& s, const LitPair* lits, uint32 size, weight_t w) {
	temp_.start(2);
	for (uint32 i = 0; i != size; ++i) { temp_.add(s, lits[i].lit); }
	if (!temp_.unsat()) {
		return addOllCon(s, temp_, w);
	}
	Literal fix = !temp_.lits.empty() ? temp_.lits[0].first : lits[0].lit;
	return temp_.bound < 2 || fixLit(s, fix);
}